

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack16.h
# Opt level: O0

void ncnn::padding_replicate_pack16_avx512(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int x_8;
  int x_7;
  int x_6;
  __m512 _p_2;
  float *ptr0_1;
  int y_2;
  int x_5;
  int x_4;
  int x_3;
  __m512 _p_1;
  int y_1;
  int x_2;
  int x_1;
  int x;
  __m512 _p;
  float *ptr0;
  int y;
  float *outptr;
  float *ptr;
  int local_6cc;
  int local_6c8;
  int local_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 *local_658;
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 *local_550;
  int local_544;
  undefined8 *local_540;
  undefined8 *local_538;
  
  local_538 = (undefined8 *)*in_RDI;
  local_540 = (undefined8 *)*in_RSI;
  for (local_544 = 0; local_544 < in_EDX; local_544 = local_544 + 1) {
    local_5c0 = *local_538;
    uStack_5b8 = local_538[1];
    uStack_5b0 = local_538[2];
    uStack_5a8 = local_538[3];
    uStack_5a0 = local_538[4];
    uStack_598 = local_538[5];
    uStack_590 = local_538[6];
    uStack_588 = local_538[7];
    for (local_5c4 = 0; local_5c4 < in_R8D; local_5c4 = local_5c4 + 1) {
      *local_540 = local_5c0;
      local_540[1] = uStack_5b8;
      local_540[2] = uStack_5b0;
      local_540[3] = uStack_5a8;
      local_540[4] = uStack_5a0;
      local_540[5] = uStack_598;
      local_540[6] = uStack_590;
      local_540[7] = uStack_588;
      local_540 = local_540 + 8;
    }
    local_550 = local_538;
    for (local_5c8 = 0; local_5c8 < *(int *)((long)in_RDI + 0x2c); local_5c8 = local_5c8 + 1) {
      local_5c0 = *local_550;
      uStack_5b8 = local_550[1];
      uStack_5b0 = local_550[2];
      uStack_5a8 = local_550[3];
      uStack_5a0 = local_550[4];
      uStack_598 = local_550[5];
      uStack_590 = local_550[6];
      uStack_588 = local_550[7];
      *local_540 = local_5c0;
      local_540[1] = uStack_5b8;
      local_540[2] = uStack_5b0;
      local_540[3] = uStack_5a8;
      local_540[4] = uStack_5a0;
      local_540[5] = uStack_598;
      local_540[6] = uStack_590;
      local_540[7] = uStack_588;
      local_550 = local_550 + 8;
      local_540 = local_540 + 8;
    }
    for (local_5cc = 0; local_5cc < in_R9D; local_5cc = local_5cc + 1) {
      *local_540 = local_5c0;
      local_540[1] = uStack_5b8;
      local_540[2] = uStack_5b0;
      local_540[3] = uStack_5a8;
      local_540[4] = uStack_5a0;
      local_540[5] = uStack_598;
      local_540[6] = uStack_590;
      local_540[7] = uStack_588;
      local_540 = local_540 + 8;
    }
  }
  for (local_5d0 = 0; local_5d0 < (int)in_RDI[6]; local_5d0 = local_5d0 + 1) {
    local_640 = *local_538;
    uStack_638 = local_538[1];
    uStack_630 = local_538[2];
    uStack_628 = local_538[3];
    uStack_620 = local_538[4];
    uStack_618 = local_538[5];
    uStack_610 = local_538[6];
    uStack_608 = local_538[7];
    for (local_644 = 0; local_644 < in_R8D; local_644 = local_644 + 1) {
      *local_540 = local_640;
      local_540[1] = uStack_638;
      local_540[2] = uStack_630;
      local_540[3] = uStack_628;
      local_540[4] = uStack_620;
      local_540[5] = uStack_618;
      local_540[6] = uStack_610;
      local_540[7] = uStack_608;
      local_540 = local_540 + 8;
    }
    for (local_648 = 0; local_648 < *(int *)((long)in_RDI + 0x2c); local_648 = local_648 + 1) {
      local_640 = *local_538;
      uStack_638 = local_538[1];
      uStack_630 = local_538[2];
      uStack_628 = local_538[3];
      uStack_620 = local_538[4];
      uStack_618 = local_538[5];
      uStack_610 = local_538[6];
      uStack_608 = local_538[7];
      *local_540 = local_640;
      local_540[1] = uStack_638;
      local_540[2] = uStack_630;
      local_540[3] = uStack_628;
      local_540[4] = uStack_620;
      local_540[5] = uStack_618;
      local_540[6] = uStack_610;
      local_540[7] = uStack_608;
      local_538 = local_538 + 8;
      local_540 = local_540 + 8;
    }
    for (local_64c = 0; local_64c < in_R9D; local_64c = local_64c + 1) {
      *local_540 = local_640;
      local_540[1] = uStack_638;
      local_540[2] = uStack_630;
      local_540[3] = uStack_628;
      local_540[4] = uStack_620;
      local_540[5] = uStack_618;
      local_540[6] = uStack_610;
      local_540[7] = uStack_608;
      local_540 = local_540 + 8;
    }
  }
  local_538 = (undefined8 *)((long)local_538 + (long)(*(int *)((long)in_RDI + 0x2c) << 4) * -4);
  for (local_650 = 0; local_650 < in_ECX; local_650 = local_650 + 1) {
    local_6c0 = *local_538;
    uStack_6b8 = local_538[1];
    uStack_6b0 = local_538[2];
    uStack_6a8 = local_538[3];
    uStack_6a0 = local_538[4];
    uStack_698 = local_538[5];
    uStack_690 = local_538[6];
    uStack_688 = local_538[7];
    for (local_6c4 = 0; local_6c4 < in_R8D; local_6c4 = local_6c4 + 1) {
      *local_540 = local_6c0;
      local_540[1] = uStack_6b8;
      local_540[2] = uStack_6b0;
      local_540[3] = uStack_6a8;
      local_540[4] = uStack_6a0;
      local_540[5] = uStack_698;
      local_540[6] = uStack_690;
      local_540[7] = uStack_688;
      local_540 = local_540 + 8;
    }
    local_658 = local_538;
    for (local_6c8 = 0; local_6c8 < *(int *)((long)in_RDI + 0x2c); local_6c8 = local_6c8 + 1) {
      local_6c0 = *local_658;
      uStack_6b8 = local_658[1];
      uStack_6b0 = local_658[2];
      uStack_6a8 = local_658[3];
      uStack_6a0 = local_658[4];
      uStack_698 = local_658[5];
      uStack_690 = local_658[6];
      uStack_688 = local_658[7];
      *local_540 = local_6c0;
      local_540[1] = uStack_6b8;
      local_540[2] = uStack_6b0;
      local_540[3] = uStack_6a8;
      local_540[4] = uStack_6a0;
      local_540[5] = uStack_698;
      local_540[6] = uStack_690;
      local_540[7] = uStack_688;
      local_658 = local_658 + 8;
      local_540 = local_540 + 8;
    }
    for (local_6cc = 0; local_6cc < in_R9D; local_6cc = local_6cc + 1) {
      *local_540 = local_6c0;
      local_540[1] = uStack_6b8;
      local_540[2] = uStack_6b0;
      local_540[3] = uStack_6a8;
      local_540[4] = uStack_6a0;
      local_540[5] = uStack_698;
      local_540[6] = uStack_690;
      local_540[7] = uStack_688;
      local_540 = local_540 + 8;
    }
  }
  return;
}

Assistant:

static void padding_replicate_pack16_avx512(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    const float* ptr = src;
    float* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        const float* ptr0 = ptr;
        __m512 _p = _mm512_load_ps(ptr0);
        for (int x = 0; x < left; x++)
        {
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm512_load_ps(ptr0);
            _mm512_store_ps(outptr, _p);
            ptr0 += 16;
            outptr += 16;
        }
        for (int x = 0; x < right; x++)
        {
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        __m512 _p = _mm512_load_ps(ptr);
        for (int x = 0; x < left; x++)
        {
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm512_load_ps(ptr);
            _mm512_store_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }
        for (int x = 0; x < right; x++)
        {
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
    }
    // fill bottom
    ptr -= src.w * 16;
    for (int y = 0; y < bottom; y++)
    {
        const float* ptr0 = ptr;
        __m512 _p = _mm512_load_ps(ptr0);
        for (int x = 0; x < left; x++)
        {
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
        for (int x = 0; x < src.w; x++)
        {
            _p = _mm512_load_ps(ptr0);
            _mm512_store_ps(outptr, _p);
            ptr0 += 16;
            outptr += 16;
        }
        for (int x = 0; x < right; x++)
        {
            _mm512_store_ps(outptr, _p);
            outptr += 16;
        }
    }
}